

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O1

void __thiscall
tchecker::clockbounds::local_m_map_t::local_m_map_t(local_m_map_t *this,local_m_map_t *m)

{
  uint uVar1;
  map_t *pmVar2;
  ulong uVar3;
  allocator_type local_29;
  value_type local_28;
  
  uVar1 = m->_loc_nb;
  this->_loc_nb = uVar1;
  this->_clock_nb = m->_clock_nb;
  local_28 = (value_type)0x0;
  std::
  vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
  ::vector(&this->_M,(ulong)uVar1,&local_28,&local_29);
  if (this->_loc_nb != 0) {
    uVar3 = 0;
    do {
      pmVar2 = clone_map((m->_M).
                         super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar3]);
      (this->_M).
      super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar3] = pmVar2;
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->_loc_nb);
  }
  return;
}

Assistant:

local_m_map_t::local_m_map_t(tchecker::clockbounds::local_m_map_t const & m)
    : _loc_nb(m._loc_nb), _clock_nb(m._clock_nb), _M(_loc_nb, nullptr)
{
  for (tchecker::loc_id_t id = 0; id < _loc_nb; ++id)
    _M[id] = tchecker::clockbounds::clone_map(*m._M[id]);
}